

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::writeFile
          (SoPlexBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *intVars,bool unscale,bool writeZeroObjective)

{
  Verbosity VVar1;
  SPxLPBase<double> *pSVar2;
  SPxOut *pSVar3;
  Verbosity old_verbosity;
  undefined7 in_register_00000089;
  SPxLPBase<double> *local_38;
  
  pSVar2 = this->_realLP;
  if (((int)CONCAT71(in_register_00000089,unscale) == 0) || (pSVar2->_isScaled != true)) {
    (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x22])
              (pSVar2,filename,rowNames,colNames,intVars,(ulong)writeZeroObjective);
  }
  else {
    VVar1 = (this->spxout).m_verbosity;
    if (4 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO3;
      pSVar3 = soplex::operator<<(&this->spxout,"copy LP to write unscaled original problem");
      std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
      (this->spxout).m_verbosity = VVar1;
    }
    local_38 = (SPxLPBase<double> *)0x0;
    spx_alloc<soplex::SPxLPBase<double>*>(&local_38,1);
    pSVar2 = local_38;
    SPxLPBase<double>::SPxLPBase(local_38,this->_realLP);
    local_38 = pSVar2;
    SPxLPBase<double>::unscaleLP(pSVar2);
    (*(local_38->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x22])
              (local_38,filename,rowNames,colNames,intVars,(ulong)writeZeroObjective);
    (**(local_38->super_LPRowSetBase<double>).super_SVSetBase<double>.
       super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)();
    free(local_38);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::writeFile(const char* filename, const NameSet* rowNames,
                              const NameSet* colNames, const DIdxSet* intVars, const bool unscale,
                              const bool writeZeroObjective) const
{
   ///@todo implement return value
   if(unscale && _realLP->isScaled())
   {
      SPX_MSG_INFO3(spxout, spxout << "copy LP to write unscaled original problem" << std::endl;)
      SPxLPBase<R>* origLP;
      origLP = nullptr;
      spx_alloc(origLP);
      origLP = new(origLP) SPxLPBase<R>(*_realLP);
      origLP->unscaleLP();
      origLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);
      origLP->~SPxLPBase<R>();
      spx_free(origLP);
   }
   else
      _realLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);

   return true;
}